

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpfile.c
# Opt level: O0

int main(void)

{
  int iVar1;
  FILE **ppFVar2;
  FILE *pFVar3;
  FILE *fhtest;
  char filename [46];
  FILE *fh;
  
  register0x00000000 = tmpfile();
  if (register0x00000000 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x76,"( fh = tmpfile() ) != NULL");
  }
  iVar1 = fputc(0x78,stack0xffffffffffffffe8);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x77,"fputc( \'x\', fh ) == \'x\'");
  }
  ppFVar2 = (FILE **)strcpy((char *)&fhtest,*(char **)&stack0xffffffffffffffe8->_fileno);
  if (ppFVar2 != &fhtest) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x79,"strcpy( filename, fh->filename ) == filename");
  }
  pFVar3 = fopen((char *)&fhtest,"r");
  if (pFVar3 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7a,"( fhtest = fopen( filename, \"r\" ) ) != ((void *)0)");
  }
  iVar1 = fclose(pFVar3);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7b,"fclose( fhtest ) == 0");
  }
  iVar1 = fclose(stack0xffffffffffffffe8);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7d,"fclose( fh ) == 0");
  }
  pFVar3 = fopen((char *)&fhtest,"r");
  if (pFVar3 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/stdio/tmpfile.c, line %d - %s\n"
           ,0x7f,"fopen( filename, \"r\" ) == ((void *)0)");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * fh;
#ifndef REGTEST
    char filename[ L_tmpnam ];
    FILE * fhtest;
#endif
    TESTCASE( ( fh = tmpfile() ) != NULL );
    TESTCASE( fputc( 'x', fh ) == 'x' );
    /* Checking that file is actually there */
    TESTCASE_NOREG( strcpy( filename, fh->filename ) == filename );
    TESTCASE_NOREG( ( fhtest = fopen( filename, "r" ) ) != NULL );
    TESTCASE_NOREG( fclose( fhtest ) == 0 );
    /* Closing tmpfile */
    TESTCASE( fclose( fh ) == 0 );
    /* Checking that file was deleted */
    TESTCASE_NOREG( fopen( filename, "r" ) == NULL );
    return TEST_RESULTS;
}